

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O1

void Psr_ManVecFree(Vec_Ptr_t *vPrs)

{
  void *__ptr;
  long lVar1;
  
  if (0 < vPrs->nSize) {
    lVar1 = 0;
    do {
      __ptr = vPrs->pArray[lVar1];
      if (*(Abc_Nam_t **)((long)__ptr + 8) != (Abc_Nam_t *)0x0) {
        Abc_NamDeref(*(Abc_Nam_t **)((long)__ptr + 8));
      }
      if (*(void **)((long)__ptr + 0x18) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x18));
        *(undefined8 *)((long)__ptr + 0x18) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x10) = 0;
      if (*(void **)((long)__ptr + 0x28) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x28));
        *(undefined8 *)((long)__ptr + 0x28) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x20) = 0;
      if (*(void **)((long)__ptr + 0x38) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x38));
        *(undefined8 *)((long)__ptr + 0x38) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x30) = 0;
      if (*(void **)((long)__ptr + 0x48) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x48));
        *(undefined8 *)((long)__ptr + 0x48) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x40) = 0;
      if (*(void **)((long)__ptr + 0x58) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x58));
        *(undefined8 *)((long)__ptr + 0x58) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x50) = 0;
      if (*(void **)((long)__ptr + 0x68) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x68));
        *(undefined8 *)((long)__ptr + 0x68) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x60) = 0;
      if (*(void **)((long)__ptr + 0x78) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x78));
        *(undefined8 *)((long)__ptr + 0x78) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x70) = 0;
      if (*(void **)((long)__ptr + 0x88) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x88));
        *(undefined8 *)((long)__ptr + 0x88) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x80) = 0;
      if (*(void **)((long)__ptr + 0x98) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x98));
        *(undefined8 *)((long)__ptr + 0x98) = 0;
      }
      *(undefined8 *)((long)__ptr + 0x90) = 0;
      if (*(void **)((long)__ptr + 0xa8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xa8));
        *(undefined8 *)((long)__ptr + 0xa8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xa0) = 0;
      if (*(void **)((long)__ptr + 0xb8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xb8));
        *(undefined8 *)((long)__ptr + 0xb8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xb0) = 0;
      if (*(void **)((long)__ptr + 200) != (void *)0x0) {
        free(*(void **)((long)__ptr + 200));
        *(undefined8 *)((long)__ptr + 200) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xc0) = 0;
      if (*(void **)((long)__ptr + 0xd8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0xd8));
        *(undefined8 *)((long)__ptr + 0xd8) = 0;
      }
      *(undefined8 *)((long)__ptr + 0xd0) = 0;
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < vPrs->nSize);
  }
  if (vPrs->pArray != (void **)0x0) {
    free(vPrs->pArray);
    vPrs->pArray = (void **)0x0;
  }
  free(vPrs);
  return;
}

Assistant:

static inline void Psr_ManVecFree( Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk; int i;
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_NtkFree( pNtk );
    Vec_PtrFree( vPrs );
}